

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

void uv__fs_done(uv__work *w,int status)

{
  uv__queue *puVar1;
  uv_fs_t *req;
  int status_local;
  uv__work *w_local;
  
  if (*(int *)&w[-9].wq.next[2].next == 0) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/fs.c"
                  ,0x69b,"void uv__fs_done(struct uv__work *, int)");
  }
  puVar1 = w[-9].wq.next;
  *(int *)&puVar1[2].next = *(int *)&puVar1[2].next + -1;
  if (status == -0x7d) {
    if (w[-7].wq.next != (uv__queue *)0x0) {
      __assert_fail("req->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/fs.c"
                    ,0x69e,"void uv__fs_done(struct uv__work *, int)");
    }
    w[-7].wq.next = (uv__queue *)0xffffffffffffff83;
  }
  (*(code *)w[-7].loop)(&w[-9].loop);
  return;
}

Assistant:

static void uv__fs_done(struct uv__work* w, int status) {
  uv_fs_t* req;

  req = container_of(w, uv_fs_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == UV_ECANCELED) {
    assert(req->result == 0);
    req->result = UV_ECANCELED;
  }

  req->cb(req);
}